

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O2

void thread_proc(void)

{
  IBackend *pIVar1;
  pointer puVar2;
  log_entry *this;
  unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_> *backend;
  pointer puVar3;
  
  while (cancel == false) {
    this = log_queue::pop_top(queue);
    puVar2 = backends.
             super__Vector_base<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>,_std::allocator<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (this != (log_entry *)0x0) {
      for (puVar3 = backends.
                    super__Vector_base<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>,_std::allocator<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar2; puVar3 = puVar3 + 1
          ) {
        if ((ulong)this->level < 4) {
          pIVar1 = (puVar3->_M_t).
                   super___uniq_ptr_impl<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_f8n::debug::IBackend_*,_std::default_delete<f8n::debug::IBackend>_>
                   .super__Head_base<0UL,_f8n::debug::IBackend_*,_false>._M_head_impl;
          (**(code **)((long)pIVar1->_vptr_IBackend +
                      *(long *)(&DAT_001e6f30 + (ulong)this->level * 8)))
                    (pIVar1,&this->tag,&this->message);
        }
      }
      log_queue::log_entry::~log_entry(this);
      operator_delete(this,0x48);
    }
  }
  return;
}

Assistant:

static void thread_proc() {
    try {
        while (!cancel) {
            log_queue::log_entry* entry = queue->pop_top();
            if (entry) {
                for (auto& backend : backends) {
                    switch (entry->level) {
                        case debug_level::verbose:
                            backend->verbose(entry->tag, entry->message);
                            break;
                        case debug_level::info:
                            backend->info(entry->tag, entry->message);
                            break;
                        case debug_level::warning:
                            backend->warning(entry->tag, entry->message);
                            break;
                        case debug_level::error:
                            backend->verbose(entry->tag, entry->message);
                            break;
                    }
                }
                delete entry;
            }
        }
    }
    catch (log_queue::stopped_exception&) {
    }
}